

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::DictionaryTypeHandlerBase<int>::TryGetFixedProperty<false,true>
          (DictionaryTypeHandlerBase<int> *this,PropertyRecord *propertyRecord,Var *pProperty,
          FixedPropertyKind propertyType,ScriptContext *requestContext)

{
  RecyclerWeakReference<Js::DynamicObject> *pRVar1;
  code *pcVar2;
  bool bVar3;
  int index;
  undefined4 *puVar4;
  RecyclableObject *obj;
  DynamicObject *this_00;
  bool bVar5;
  int local_54;
  undefined4 *puStack_50;
  int i;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord_local;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  pRVar1 = (this->singletonInstance).ptr;
  if (pRVar1 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    this_00 = (DynamicObject *)0x0;
  }
  else {
    this_00 = (DynamicObject *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef;
  }
  if (this_00 == (DynamicObject *)0x0) {
    return false;
  }
  if ((((((this_00->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr != requestContext) {
    return false;
  }
  local_48 = propertyRecord;
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_48,
                     (DictionaryPropertyDescriptor<int> **)&propertyRecord_local,&local_54);
  if (bVar3) {
    if ((((ulong)(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject & 0x800) == 0) &&
       (((ulong)(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 0x20) != 0)) {
      index = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>
                        ((DictionaryPropertyDescriptor<int> *)propertyRecord_local);
      bVar5 = true;
      if (index != -1) {
        if ((uint)local_48->pid < 0x10) {
          AssertCount = AssertCount + 1;
          descriptor._4_4_ = index;
          Throw::LogAssert();
          puStack_50 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puStack_50 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0xa23,
                                      "(!IsInternalPropertyId(propertyRecord->GetPropertyId()))",
                                      "!IsInternalPropertyId(propertyRecord->GetPropertyId())");
          if (!bVar3) goto LAB_00db9481;
          *puStack_50 = 0;
          index = descriptor._4_4_;
        }
        obj = (RecyclableObject *)DynamicObject::GetSlot(this_00,index);
        if ((obj != (RecyclableObject *)0x0) &&
           ((((bVar3 = DynamicTypeHandler::IsFixedMethodProperty
                                 (&this->super_DynamicTypeHandler,propertyType),
              (ulong)obj >> 0x30 == 0 && (bVar3)) &&
             (bVar3 = VarIsImpl<Js::JavascriptFunction>(obj), bVar3)) ||
            (bVar3 = DynamicTypeHandler::IsFixedDataProperty
                               (&this->super_DynamicTypeHandler,propertyType), bVar3)))) {
          *pProperty = obj;
          *(byte *)&(propertyRecord_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject =
               *(byte *)&(propertyRecord_local->super_FinalizableObject).
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject | 0x40;
          bVar3 = false;
          goto LAB_00db9391;
        }
      }
      bVar3 = true;
    }
    else {
      bVar3 = false;
      bVar5 = false;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0xa32,"(allowNonExistent)",
                                "Trying to get a fixed function instance for a non-existent property?"
                               );
    if (!bVar3) {
LAB_00db9481:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    bVar3 = true;
    bVar5 = true;
  }
LAB_00db9391:
  if (bVar3) {
    return false;
  }
  return bVar5;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::TryGetFixedProperty(PropertyRecord const * propertyRecord, Var * pProperty, FixedPropertyKind propertyType, ScriptContext * requestContext)
    {
        // Note: This function is not thread-safe and cannot be called from the JIT thread.  That's why we collect and
        // cache any fixed function instances during work item creation on the main thread.
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        if (localSingletonInstance != nullptr && localSingletonInstance->GetScriptContext() == requestContext)
        {
            DictionaryPropertyDescriptor<T>* descriptor;
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted || !descriptor->GetIsFixed())
                {
                    return false;
                }
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    Assert(!IsInternalPropertyId(propertyRecord->GetPropertyId()));
                    Var value = localSingletonInstance->GetSlot(dataSlot);
                    if (value && ((IsFixedMethodProperty(propertyType) && VarIs<JavascriptFunction>(value)) || IsFixedDataProperty(propertyType)))
                    {
                        *pProperty = value;
                        if (markAsUsed)
                        {
                            descriptor->SetUsedAsFixed(true);
                        }
                        return true;
                    }
                }
            }
            else
            {
                AssertMsg(allowNonExistent, "Trying to get a fixed function instance for a non-existent property?");
            }
        }

        return false;
    }